

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cycles.cpp
# Opt level: O1

void __thiscall Analizer::Analizer(Analizer *this)

{
  (this->super_actor).context_.object_ = (object_t *)0x0;
  (this->super_actor).self_.object_ = (object_t *)0x0;
  (this->super_actor).handlers_._M_h._M_buckets =
       &(this->super_actor).handlers_._M_h._M_single_bucket;
  (this->super_actor).handlers_._M_h._M_bucket_count = 1;
  (this->super_actor).handlers_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_actor).handlers_._M_h._M_element_count = 0;
  (this->super_actor).handlers_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_actor).handlers_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_actor).handlers_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_actor).terminating_ = false;
  (this->super_actor)._vptr_actor = (_func_int **)&PTR__Analizer_0010e7f0;
  (this->m_listeners).super__Vector_base<acto::actor_ref,_std::allocator<acto::actor_ref>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_listeners).super__Vector_base<acto::actor_ref,_std::allocator<acto::actor_ref>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_listeners).super__Vector_base<acto::actor_ref,_std::allocator<acto::actor_ref>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  acto::actor::handler<msg_complete,Analizer,msg_complete_const&>(&this->super_actor,0x103a08);
  acto::actor::handler<msg_start,Analizer,msg_start_const&>(&this->super_actor,0x103b68);
  acto::actor::handler<msg_stop,Analizer,msg_stop_const&>(&this->super_actor,0x103d8e);
  return;
}

Assistant:

Analizer() {
    handler< msg_complete >(&Analizer::doComplete);

    handler< msg_start >   (&Analizer::doStart);
    handler< msg_stop  >   (&Analizer::doStop);
  }